

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

void __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::buffered_reader(buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                  *this,function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                        *refill,size_t buffer_size)

{
  storage_type<pstore::gsl::details::extent_type<_1L>_> sVar1;
  allocator_type local_1a;
  value_type_conflict1 local_19;
  
  std::
  function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::function(&this->refill_,refill);
  local_19 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buf_,buffer_size + (buffer_size == 0),&local_19,&local_1a);
  sVar1 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
          pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (&this->buf_);
  (this->span_).storage_ = sVar1;
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&this->pos_);
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&this->end_);
  this->is_eof_ = false;
  (this->push_).valid_ = false;
  check_invariants(this);
  return;
}

Assistant:

buffered_reader<IO, RefillFunction>::buffered_reader (RefillFunction const refill,
                                                              std::size_t const buffer_size)
                : refill_{refill}
                , buf_ (std::max (buffer_size, std::size_t{1}), std::uint8_t{0})
                , span_{gsl::make_span (buf_)}
                , pos_{span_.begin ()}
                , end_{span_.begin ()} {
            this->check_invariants ();
        }